

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testAttributes.cpp
# Opt level: O3

void testAttributes(string *tempDir)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  size_t __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Iterator IVar4;
  Iterator IVar5;
  _Base_ptr p_Var6;
  Iterator IVar7;
  _Alloc_hider _Var8;
  undefined8 uVar9;
  bool bVar10;
  char *pcVar11;
  ostream *poVar12;
  Header *pHVar13;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *pTVar14;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *pTVar15;
  TypedAttribute<float> *pTVar16;
  TypedAttribute<int> *pTVar17;
  TypedAttribute<Imath_3_2::Matrix33<float>_> *pTVar18;
  TypedAttribute<Imath_3_2::Matrix44<float>_> *pTVar19;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pTVar20;
  TypedAttribute<Imath_3_2::Vec2<int>_> *pTVar21;
  TypedAttribute<Imath_3_2::Vec2<float>_> *pTVar22;
  TypedAttribute<Imath_3_2::Vec3<int>_> *pTVar23;
  TypedAttribute<Imath_3_2::Vec3<float>_> *pTVar24;
  TypedAttribute<double> *pTVar25;
  TypedAttribute<Imf_3_4::Chromaticities> *pTVar26;
  TypedAttribute<Imf_3_4::Envmap> *pTVar27;
  TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pTVar28;
  TypedAttribute<Imath_3_2::Matrix33<double>_> *pTVar29;
  TypedAttribute<Imath_3_2::Matrix44<double>_> *pTVar30;
  TypedAttribute<Imath_3_2::Vec2<double>_> *pTVar31;
  TypedAttribute<Imath_3_2::Vec3<double>_> *pTVar32;
  TypedAttribute<Imf_3_4::DeepImageState> *pTVar33;
  TypedAttribute<std::vector<float,_std::allocator<float>_>_> *pTVar34;
  long *plVar35;
  OpaqueAttribute *pOVar36;
  char *__s2;
  iterator iVar37;
  iterator iVar38;
  _Rb_tree_node_base *p_Var39;
  _Rb_tree_node_base *p_Var40;
  int iVar41;
  float *pfVar42;
  int iVar43;
  float *pfVar44;
  pointer pfVar45;
  long lVar46;
  ulong uVar47;
  int iVar48;
  int iVar49;
  uint uVar50;
  Iterator tmp_1;
  Iterator tmp;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar55;
  undefined1 auVar56 [16];
  Iterator first;
  double dStack_470;
  _Base_ptr local_468;
  _Base_ptr p_Stack_460;
  _Base_ptr local_458;
  double dStack_450;
  double local_448;
  double dStack_440;
  double local_438;
  OutputFile out;
  undefined4 uStack_424;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  uint local_400;
  long local_3f0;
  undefined1 local_329;
  Header hdr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_318;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_308;
  FloatVector a23;
  DeepImageState a21;
  Envmap a14;
  int a4;
  float a3;
  Iterator last;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  char *local_270;
  ChannelList channels;
  V3i a10;
  string filename;
  FloatVector a22;
  double a12;
  V2i a8;
  string a7;
  Chromaticities a13;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  StringVector a20;
  StringVector a15;
  FrameBuffer fb;
  long lVar57;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing built-in attributes",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_270 = (char *)operator_new__(0x29bf4);
  auVar52 = _DAT_001b7b10;
  auVar51 = _DAT_001b7b00;
  pcVar11 = local_270 + 4;
  iVar41 = 1;
  iVar43 = 0;
  iVar54 = (int)DAT_001b7b20;
  iVar55 = DAT_001b7b20._4_4_;
  uVar47 = 0;
  do {
    iVar49 = (int)((uVar47 & 0xffffffff) / 0x11);
    iVar48 = iVar41 + iVar49 * -0xaa;
    iVar49 = iVar43 + iVar49 * -0xaa;
    uVar50 = 0;
    lVar46 = 0;
    auVar56 = auVar51;
    do {
      if (SUB164(auVar56 ^ auVar52,4) == iVar55 && SUB164(auVar56 ^ auVar52,0) < iVar54) {
        *(float *)(pcVar11 + lVar46 + -4) = (float)(int)(iVar49 + (uVar50 / 10) * -10);
        *(float *)(pcVar11 + lVar46) = (float)(int)(iVar48 + (uVar50 / 10) * -10);
      }
      lVar57 = auVar56._8_8_;
      auVar56._0_8_ = auVar56._0_8_ + 2;
      auVar56._8_8_ = lVar57 + 2;
      lVar46 = lVar46 + 8;
      iVar48 = iVar48 + 2;
      uVar50 = uVar50 + 2;
      iVar49 = iVar49 + 2;
    } while (lVar46 != 0x368);
    uVar47 = uVar47 + 1;
    pcVar11 = pcVar11 + 0x364;
    iVar41 = iVar41 + 10;
    iVar43 = iVar43 + 10;
  } while (uVar47 != 0xc5);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&filename);
  _Var8 = filename._M_dataplus;
  Imf_3_4::Attribute::registerAttributeType
            ("testOpaque",Imf_3_4::TypedAttribute<Imf_3_4::TestOpaque>::makeNewAttribute);
  last._i._M_node = (iterator)(_Base_ptr)0x400000003f800000;
  local_2a8 = 0x40c0000040a00000;
  uStack_2a0 = 0x4100000040e00000;
  local_298 = 0x4120000041100000;
  uStack_290 = 0x4140000041300000;
  local_288 = 0x4160000041500000;
  uStack_280 = 0x4180000041700000;
  a7._M_dataplus._M_p = (pointer)&a7.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&a7,"extensive rebuilding by Nebuchadrezzar has left","");
  _out = (undefined **)0x400000003f800000;
  channels._map._M_t._M_impl._0_8_ = 0x4080000040400000;
  first._i._M_node = (iterator)(_Base_ptr)0x40c0000040a00000;
  _hdr = (_Rb_tree_node_base *)0x4100000040e00000;
  Imf_3_4::Chromaticities::Chromaticities
            (&a13,(Vec2 *)&out,(Vec2 *)&channels,(Vec2 *)&first,(Vec2 *)&hdr);
  a15.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a15.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  a15.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418._M_allocated_capacity = 0x206e6163206f6877;
  local_418._8_2_ = 0x7073;
  local_418._M_local_buf[10] = 'i';
  local_418._M_local_buf[0xb] = 'n';
  local_418._12_4_ = local_418._12_4_ & 0xffffff00;
  _out = (undefined **)&local_418;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&a15,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_out != &local_418) {
    operator_delete(_out,local_418._M_allocated_capacity + 1);
  }
  local_418._M_allocated_capacity = local_418._M_allocated_capacity & 0xffffffffffffff00;
  _out = (undefined **)&local_418;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&a15,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_out != &local_418) {
    operator_delete(_out,local_418._M_allocated_capacity + 1);
  }
  local_418._M_allocated_capacity = 0x6e69207761727473;
  local_418._8_2_ = 0x6f74;
  local_418._M_local_buf[10] = '\0';
  _out = (undefined **)&local_418;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&a15,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_out != &local_418) {
    operator_delete(_out,local_418._M_allocated_capacity + 1);
  }
  local_418._M_allocated_capacity._0_5_ = 0x646c6f67;
  _out = (undefined **)&local_418;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&a15,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_out != &local_418) {
    operator_delete(_out,local_418._M_allocated_capacity + 1);
  }
  first._i._M_node = (iterator)(_Base_ptr)0x4028000000000000;
  dStack_470 = 13.0;
  local_468 = (_Base_ptr)0x402c000000000000;
  p_Stack_460 = (_Base_ptr)0x402e000000000000;
  local_458 = (_Base_ptr)0x4030000000000000;
  dStack_450 = 17.0;
  local_448 = 18.0;
  dStack_440 = 19.0;
  local_438 = 20.0;
  channels._map._M_t._M_impl._0_8_ = 0x4000000000000000;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x40080000;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x4010000000000000;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x4014000000000000
  ;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x4018000000000000;
  channels._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x401c000000000000;
  a20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  a20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  _out = 0x3fc00000;
  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
            (&a23,(iterator)0x0,(float *)&out);
  _out = 0xbfc00000;
  if (a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&a23,(iterator)
                    a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish,(float *)&out);
  }
  else {
    *a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = -1.5;
    a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish + 1;
  }
  _out = 0x41700000;
  if (a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&a23,(iterator)
                    a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish,(float *)&out);
  }
  else {
    *a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = 15.0;
    a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish + 1;
  }
  _out = 0x43160000;
  if (a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&a23,(iterator)
                    a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish,(float *)&out);
  }
  else {
    *a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = 150.0;
    a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = a23.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish + 1;
  }
  _out = (undefined **)0x0;
  Imf_3_4::Header::Header(&hdr,0xd9,0xc5,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::TypedAttribute((Box *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b7e66);
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::TypedAttribute((Box *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b7ef9);
  Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>> *)&out);
  Imf_3_4::TypedAttribute<float>::TypedAttribute((float *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b7f32);
  Imf_3_4::TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)&out);
  Imf_3_4::TypedAttribute<int>::TypedAttribute((int *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b7f69);
  Imf_3_4::TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::TypedAttribute((Matrix33 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b7fa1);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix33<float>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::TypedAttribute((Matrix44 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b7fd9);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix44<float>> *)&out);
  Imf_3_4::TypedAttribute<std::__cxx11::string>::TypedAttribute((string *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b8013);
  Imf_3_4::TypedAttribute<std::__cxx11::string>::~TypedAttribute
            ((TypedAttribute<std::__cxx11::string> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>::TypedAttribute((Vec2 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b804a);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<int>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>::TypedAttribute((Vec2 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b8081);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<float>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>::TypedAttribute((Vec3 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b80b9);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<int>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>::TypedAttribute((Vec3 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b80f2);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<float>> *)&out);
  Imf_3_4::TypedAttribute<double>::TypedAttribute((double *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b812e);
  Imf_3_4::TypedAttribute<double>::~TypedAttribute((TypedAttribute<double> *)&out);
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::TypedAttribute((Chromaticities *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)"a13");
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::Chromaticities> *)&out);
  Imf_3_4::TypedAttribute<Imf_3_4::Envmap>::TypedAttribute((Envmap *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b82a8);
  Imf_3_4::TypedAttribute<Imf_3_4::Envmap>::~TypedAttribute((TypedAttribute<Imf_3_4::Envmap> *)&out)
  ;
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  TypedAttribute((vector *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)"a15");
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  ~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<double>>::TypedAttribute((Matrix33 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b8456);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix33<double>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>>::TypedAttribute((Matrix44 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b8490);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix44<double>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<double>>::TypedAttribute((Vec2 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b84c9);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec2<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec2<double>> *)&out);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<double>>::TypedAttribute((Vec3 *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b8502);
  Imf_3_4::TypedAttribute<Imath_3_2::Vec3<double>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Vec3<double>> *)&out);
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  TypedAttribute((vector *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b8544);
  Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
  ~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   *)&out);
  Imf_3_4::TypedAttribute<Imf_3_4::DeepImageState>::TypedAttribute((DeepImageState *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b8588);
  Imf_3_4::TypedAttribute<Imf_3_4::DeepImageState>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::DeepImageState> *)&out);
  Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>::TypedAttribute((vector *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b85c9);
  Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>::~TypedAttribute
            ((TypedAttribute<std::vector<float,std::allocator<float>>> *)&out);
  Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>::TypedAttribute((vector *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)0x1b860a);
  Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>::~TypedAttribute
            ((TypedAttribute<std::vector<float,std::allocator<float>>> *)&out);
  Imf_3_4::Attribute::Attribute((Attribute *)&out);
  _out = &PTR__Attribute_001e8040;
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)"a24");
  Imf_3_4::Attribute::~Attribute((Attribute *)&out);
  pcVar11 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar11,(Channel *)0x1c52a2);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,local_270,4,0x364,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c52a2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
  std::ostream::flush();
  remove(_Var8._M_p);
  iVar41 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile(&out,_Var8._M_p,&hdr,iVar41);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
  Imf_3_4::OutputFile::writePixels((int)&out);
  Imf_3_4::OutputFile::~OutputFile(&out);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&fb);
  Imf_3_4::Header::~Header(&hdr);
  Imf_3_4::Attribute::unRegisterAttributeType("testOpaque");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
  std::ostream::flush();
  iVar43 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var8._M_p,iVar43);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (version ",10);
  iVar43 = Imf_3_4::InputFile::version();
  poVar12 = (ostream *)std::ostream::operator<<(&std::cout,iVar43);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
  std::ostream::flush();
  pHVar13 = (Header *)Imf_3_4::InputFile::header();
  pTVar14 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>>
                      (pHVar13,"a1");
  iVar43 = -(uint)((int)*(undefined8 *)(pTVar14 + 8) == 1);
  iVar54 = -(uint)((int)((ulong)*(undefined8 *)(pTVar14 + 8) >> 0x20) == 2);
  auVar51._4_4_ = iVar43;
  auVar51._0_4_ = iVar43;
  auVar51._8_4_ = iVar54;
  auVar51._12_4_ = iVar54;
  iVar41 = movmskpd(iVar41,auVar51);
  if ((iVar41 != 3) ||
     (iVar41 = -(uint)((int)*(undefined8 *)(pTVar14 + 0x10) == 3),
     iVar43 = -(uint)((int)((ulong)*(undefined8 *)(pTVar14 + 0x10) >> 0x20) == 4),
     auVar52._4_4_ = iVar41, auVar52._0_4_ = iVar41, auVar52._8_4_ = iVar43, auVar52._12_4_ = iVar43
     , iVar41 = movmskpd((int)pTVar14,auVar52), iVar41 != 3)) {
    __assert_fail("hdr.typedAttribute<Box2iAttribute> (\"a1\").value () == a1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xe8,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar15 = Imf_3_4::Header::
            typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>>
                      (pHVar13,"a2");
  if (((((*(float *)(pTVar15 + 8) != 1.5) || (NAN(*(float *)(pTVar15 + 8)))) ||
       (*(float *)(pTVar15 + 0xc) != 2.5)) ||
      ((NAN(*(float *)(pTVar15 + 0xc)) || (*(float *)(pTVar15 + 0x10) != 3.5)))) ||
     ((NAN(*(float *)(pTVar15 + 0x10)) ||
      ((*(float *)(pTVar15 + 0x14) != 4.5 || (NAN(*(float *)(pTVar15 + 0x14)))))))) {
    __assert_fail("hdr.typedAttribute<Box2fAttribute> (\"a2\").value () == a2",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xe9,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar16 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<float>>(pHVar13,"a3");
  if ((*(float *)(pTVar16 + 8) != 3.14159) || (NAN(*(float *)(pTVar16 + 8)))) {
    __assert_fail("hdr.typedAttribute<FloatAttribute> (\"a3\").value () == a3",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xea,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar17 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<int>>(pHVar13,"a4");
  if (*(int *)(pTVar17 + 8) != 0x11) {
    __assert_fail("hdr.typedAttribute<IntAttribute> (\"a4\").value () == a4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xeb,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar18 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>>
                      (pHVar13,"a5");
  if ((((((((*(float *)(pTVar18 + 8) != 11.0) || (NAN(*(float *)(pTVar18 + 8)))) ||
          (*(float *)(pTVar18 + 0xc) != 12.0)) ||
         (((NAN(*(float *)(pTVar18 + 0xc)) || (*(float *)(pTVar18 + 0x10) != 13.0)) ||
          ((NAN(*(float *)(pTVar18 + 0x10)) ||
           ((*(float *)(pTVar18 + 0x14) != 14.0 || (NAN(*(float *)(pTVar18 + 0x14)))))))))) ||
        (*(float *)(pTVar18 + 0x18) != 15.0)) ||
       (((NAN(*(float *)(pTVar18 + 0x18)) || (*(float *)(pTVar18 + 0x1c) != 16.0)) ||
        (NAN(*(float *)(pTVar18 + 0x1c)))))) ||
      (((*(float *)(pTVar18 + 0x20) != 17.0 || (NAN(*(float *)(pTVar18 + 0x20)))) ||
       ((*(float *)(pTVar18 + 0x24) != 18.0 ||
        ((NAN(*(float *)(pTVar18 + 0x24)) || (*(float *)(pTVar18 + 0x28) != 19.0)))))))) ||
     (NAN(*(float *)(pTVar18 + 0x28)))) {
    __assert_fail("hdr.typedAttribute<M33fAttribute> (\"a5\").value () == a5",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                  ,0xec,
                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pTVar19 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>>
                      (pHVar13,"a6");
  if ((*(float *)(pTVar19 + 8) == last._i._M_node._0_4_) &&
     (!NAN(*(float *)(pTVar19 + 8)) && !NAN(last._i._M_node._0_4_))) {
    if ((*(float *)(pTVar19 + 0xc) == last._i._M_node._4_4_) &&
       ((((!NAN(*(float *)(pTVar19 + 0xc)) && !NAN(last._i._M_node._4_4_) &&
          (*(float *)(pTVar19 + 0x10) == 3.0)) && (!NAN(*(float *)(pTVar19 + 0x10)))) &&
        ((*(float *)(pTVar19 + 0x14) == 4.0 && (!NAN(*(float *)(pTVar19 + 0x14)))))))) {
      if ((*(float *)(pTVar19 + 0x18) == (float)local_2a8) &&
         (!NAN(*(float *)(pTVar19 + 0x18)) && !NAN((float)local_2a8))) {
        if ((*(float *)(pTVar19 + 0x1c) == local_2a8._4_4_) &&
           (!NAN(*(float *)(pTVar19 + 0x1c)) && !NAN(local_2a8._4_4_))) {
          if ((*(float *)(pTVar19 + 0x20) == (float)uStack_2a0) &&
             (!NAN(*(float *)(pTVar19 + 0x20)) && !NAN((float)uStack_2a0))) {
            if ((*(float *)(pTVar19 + 0x24) == uStack_2a0._4_4_) &&
               (!NAN(*(float *)(pTVar19 + 0x24)) && !NAN(uStack_2a0._4_4_))) {
              if ((*(float *)(pTVar19 + 0x28) == (float)local_298) &&
                 (!NAN(*(float *)(pTVar19 + 0x28)) && !NAN((float)local_298))) {
                if ((*(float *)(pTVar19 + 0x2c) == local_298._4_4_) &&
                   (!NAN(*(float *)(pTVar19 + 0x2c)) && !NAN(local_298._4_4_))) {
                  if ((*(float *)(pTVar19 + 0x30) == (float)uStack_290) &&
                     (!NAN(*(float *)(pTVar19 + 0x30)) && !NAN((float)uStack_290))) {
                    if ((*(float *)(pTVar19 + 0x34) == uStack_290._4_4_) &&
                       (!NAN(*(float *)(pTVar19 + 0x34)) && !NAN(uStack_290._4_4_))) {
                      if ((*(float *)(pTVar19 + 0x38) == (float)local_288) &&
                         (!NAN(*(float *)(pTVar19 + 0x38)) && !NAN((float)local_288))) {
                        if ((*(float *)(pTVar19 + 0x3c) == local_288._4_4_) &&
                           (!NAN(*(float *)(pTVar19 + 0x3c)) && !NAN(local_288._4_4_))) {
                          if ((*(float *)(pTVar19 + 0x40) == (float)uStack_280) &&
                             (!NAN(*(float *)(pTVar19 + 0x40)) && !NAN((float)uStack_280))) {
                            if ((*(float *)(pTVar19 + 0x44) == uStack_280._4_4_) &&
                               (!NAN(*(float *)(pTVar19 + 0x44)) && !NAN(uStack_280._4_4_))) {
                              pTVar20 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<std::__cxx11::string>>
                                                  (pHVar13,"a7");
                              __n = *(size_t *)(pTVar20 + 0x10);
                              if ((__n != a7._M_string_length) ||
                                 ((__n != 0 &&
                                  (iVar41 = bcmp(*(void **)(pTVar20 + 8),a7._M_dataplus._M_p,__n),
                                  iVar41 != 0)))) {
                                __assert_fail("hdr.typedAttribute<StringAttribute> (\"a7\").value () == a7"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0xee,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar21 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>>
                                                  (pHVar13,"a8");
                              iVar41 = -(uint)((int)*(undefined8 *)(pTVar21 + 8) == 0x1b);
                              iVar43 = -(uint)((int)((ulong)*(undefined8 *)(pTVar21 + 8) >> 0x20) ==
                                              0x1c);
                              auVar53._4_4_ = iVar41;
                              auVar53._0_4_ = iVar41;
                              auVar53._8_4_ = iVar43;
                              auVar53._12_4_ = iVar43;
                              iVar41 = movmskpd((int)pTVar21,auVar53);
                              if (iVar41 != 3) {
                                __assert_fail("hdr.typedAttribute<V2iAttribute> (\"a8\").value () == a8"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0xef,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar22 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>>
                                                  (pHVar13,"a9");
                              if ((((*(float *)(pTVar22 + 8) != 27.5) ||
                                   (NAN(*(float *)(pTVar22 + 8)))) ||
                                  (*(float *)(pTVar22 + 0xc) != 28.5)) ||
                                 (NAN(*(float *)(pTVar22 + 0xc)))) {
                                __assert_fail("hdr.typedAttribute<V2fAttribute> (\"a9\").value () == a9"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0xf0,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar23 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>>
                                                  (pHVar13,"a10");
                              if (((*(int *)(pTVar23 + 8) != 0x25) ||
                                  (*(int *)(pTVar23 + 0xc) != 0x26)) ||
                                 (*(int *)(pTVar23 + 0x10) != 0x27)) {
                                __assert_fail("hdr.typedAttribute<V3iAttribute> (\"a10\").value () == a10"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0xf1,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar24 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>>
                                                  (pHVar13,"a11");
                              if (((*(float *)(pTVar24 + 8) != 37.5) ||
                                  (NAN(*(float *)(pTVar24 + 8)))) ||
                                 ((*(float *)(pTVar24 + 0xc) != 38.5 ||
                                  (((NAN(*(float *)(pTVar24 + 0xc)) ||
                                    (*(float *)(pTVar24 + 0x10) != 39.5)) ||
                                   (NAN(*(float *)(pTVar24 + 0x10)))))))) {
                                __assert_fail("hdr.typedAttribute<V3fAttribute> (\"a11\").value () == a11"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0xf2,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar25 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<double>>
                                                  (pHVar13,"a12");
                              if ((*(double *)(pTVar25 + 8) != 7.12342341419) ||
                                 (NAN(*(double *)(pTVar25 + 8)))) {
                                __assert_fail("hdr.typedAttribute<DoubleAttribute> (\"a12\").value () == a12"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0xf3,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar26 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>>
                                                  (pHVar13,"a13");
                              if (((*(float *)(pTVar26 + 8) != _a13) ||
                                  (NAN(*(float *)(pTVar26 + 8)) || NAN(_a13))) ||
                                 ((*(float *)(pTVar26 + 0xc) != local_104 ||
                                  (NAN(*(float *)(pTVar26 + 0xc)) || NAN(local_104))))) {
                                __assert_fail("hdr.typedAttribute<ChromaticitiesAttribute> (\"a13\").value ().red == a13.red"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0xf7,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar26 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>>
                                                  (pHVar13,"a13");
                              if ((((*(float *)(pTVar26 + 0x10) != local_100) ||
                                   (NAN(*(float *)(pTVar26 + 0x10)) || NAN(local_100))) ||
                                  (*(float *)(pTVar26 + 0x14) != local_fc)) ||
                                 (NAN(*(float *)(pTVar26 + 0x14)) || NAN(local_fc))) {
                                __assert_fail("hdr.typedAttribute<ChromaticitiesAttribute> (\"a13\") .value () .green == a13.green"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0xfc,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar26 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>>
                                                  (pHVar13,"a13");
                              if (((*(float *)(pTVar26 + 0x18) != local_f8) ||
                                  (NAN(*(float *)(pTVar26 + 0x18)) || NAN(local_f8))) ||
                                 ((*(float *)(pTVar26 + 0x1c) != local_f4 ||
                                  (NAN(*(float *)(pTVar26 + 0x1c)) || NAN(local_f4))))) {
                                __assert_fail("hdr.typedAttribute<ChromaticitiesAttribute> (\"a13\").value ().blue == a13.blue"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x100,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar26 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>>
                                                  (pHVar13,"a13");
                              if (((*(float *)(pTVar26 + 0x20) != local_f0) ||
                                  (NAN(*(float *)(pTVar26 + 0x20)) || NAN(local_f0))) ||
                                 ((*(float *)(pTVar26 + 0x24) != local_ec ||
                                  (NAN(*(float *)(pTVar26 + 0x24)) || NAN(local_ec))))) {
                                __assert_fail("hdr.typedAttribute<ChromaticitiesAttribute> (\"a13\") .value () .white == a13.white"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x105,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar27 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Envmap>>
                                                  (pHVar13,"a14");
                              if (*(int *)(pTVar27 + 8) != 1) {
                                __assert_fail("hdr.typedAttribute<EnvmapAttribute> (\"a14\").value () == a14"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x107,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar28 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                                  (pHVar13,"a15");
                              if (*(long *)(pTVar28 + 0x10) - *(long *)(pTVar28 + 8) != 0x80) {
                                __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a15\") .value () .size () == 4"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x10c,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar28 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                                  (pHVar13,"a15");
                              iVar41 = std::__cxx11::string::compare(*(char **)(pTVar28 + 8));
                              if (iVar41 != 0) {
                                __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a15\").value ()[0] == \"who can spin\""
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x110,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar28 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                                  (pHVar13,"a15");
                              iVar41 = std::__cxx11::string::compare
                                                 ((char *)(*(long *)(pTVar28 + 8) + 0x20));
                              if (iVar41 != 0) {
                                __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a15\").value ()[1] == \"\""
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x114,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar28 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                                  (pHVar13,"a15");
                              iVar41 = std::__cxx11::string::compare
                                                 ((char *)(*(long *)(pTVar28 + 8) + 0x40));
                              if (iVar41 != 0) {
                                __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a15\").value ()[2] == \"straw into\""
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x118,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar28 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                                  (pHVar13,"a15");
                              iVar41 = std::__cxx11::string::compare
                                                 ((char *)(*(long *)(pTVar28 + 8) + 0x60));
                              if (iVar41 != 0) {
                                __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a15\").value ()[3] == \"gold\""
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x11c,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar29 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<double>>>
                                                  (pHVar13,"a16");
                              if ((((((*(double *)(pTVar29 + 8) != (double)first._i._M_node) ||
                                     (NAN(*(double *)(pTVar29 + 8)) || NAN((double)first._i._M_node)
                                     )) || (*(double *)(pTVar29 + 0x10) != dStack_470)) ||
                                   ((NAN(*(double *)(pTVar29 + 0x10)) || NAN(dStack_470) ||
                                    (*(double *)(pTVar29 + 0x18) != (double)local_468)))) ||
                                  ((((NAN(*(double *)(pTVar29 + 0x18)) || NAN((double)local_468) ||
                                     ((*(double *)(pTVar29 + 0x20) != (double)p_Stack_460 ||
                                      (NAN(*(double *)(pTVar29 + 0x20)) || NAN((double)p_Stack_460))
                                      ))) || (*(double *)(pTVar29 + 0x28) != (double)local_458)) ||
                                   (((NAN(*(double *)(pTVar29 + 0x28)) || NAN((double)local_458) ||
                                     (*(double *)(pTVar29 + 0x30) != dStack_450)) ||
                                    (NAN(*(double *)(pTVar29 + 0x30)) || NAN(dStack_450))))))) ||
                                 ((((*(double *)(pTVar29 + 0x38) != local_448 ||
                                    (NAN(*(double *)(pTVar29 + 0x38)) || NAN(local_448))) ||
                                   ((*(double *)(pTVar29 + 0x40) != dStack_440 ||
                                    ((NAN(*(double *)(pTVar29 + 0x40)) || NAN(dStack_440) ||
                                     (*(double *)(pTVar29 + 0x48) != local_438)))))) ||
                                  (NAN(*(double *)(pTVar29 + 0x48)) || NAN(local_438))))) {
                                __assert_fail("hdr.typedAttribute<M33dAttribute> (\"a16\").value () == a16"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x11e,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar30 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<double>>>
                                                  (pHVar13,"a17");
                              if (((((((((*(double *)(pTVar30 + 8) !=
                                          (double)channels._map._M_t._M_impl._0_8_) ||
                                        (NAN(*(double *)(pTVar30 + 8)) ||
                                         NAN((double)channels._map._M_t._M_impl._0_8_))) ||
                                       (*(double *)(pTVar30 + 0x10) !=
                                        (double)channels._map._M_t._M_impl.super__Rb_tree_header.
                                                _M_header._0_8_)) ||
                                      ((NAN(*(double *)(pTVar30 + 0x10)) ||
                                        NAN((double)channels._map._M_t._M_impl.super__Rb_tree_header
                                                    ._M_header._0_8_) ||
                                       (*(double *)(pTVar30 + 0x18) !=
                                        (double)channels._map._M_t._M_impl.super__Rb_tree_header.
                                                _M_header._M_parent)))) ||
                                     (NAN(*(double *)(pTVar30 + 0x18)) ||
                                      NAN((double)channels._map._M_t._M_impl.super__Rb_tree_header.
                                                  _M_header._M_parent))) ||
                                    ((*(double *)(pTVar30 + 0x20) !=
                                      (double)channels._map._M_t._M_impl.super__Rb_tree_header.
                                              _M_header._M_left ||
                                     (NAN(*(double *)(pTVar30 + 0x20)) ||
                                      NAN((double)channels._map._M_t._M_impl.super__Rb_tree_header.
                                                  _M_header._M_left))))) ||
                                   ((*(double *)(pTVar30 + 0x28) !=
                                     (double)channels._map._M_t._M_impl.super__Rb_tree_header.
                                             _M_header._M_right ||
                                    (((NAN(*(double *)(pTVar30 + 0x28)) ||
                                       NAN((double)channels._map._M_t._M_impl.super__Rb_tree_header.
                                                   _M_header._M_right) ||
                                      (*(double *)(pTVar30 + 0x30) !=
                                       (double)channels._map._M_t._M_impl.super__Rb_tree_header.
                                               _M_node_count)) ||
                                     (NAN(*(double *)(pTVar30 + 0x30)) ||
                                      NAN((double)channels._map._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count))))))) ||
                                  ((((*(double *)(pTVar30 + 0x38) != 8.0 ||
                                     (NAN(*(double *)(pTVar30 + 0x38)))) ||
                                    (*(double *)(pTVar30 + 0x40) != 9.0)) ||
                                   (((NAN(*(double *)(pTVar30 + 0x40)) ||
                                     (*(double *)(pTVar30 + 0x48) != 10.0)) ||
                                    ((NAN(*(double *)(pTVar30 + 0x48)) ||
                                     (((*(double *)(pTVar30 + 0x50) != 11.0 ||
                                       (NAN(*(double *)(pTVar30 + 0x50)))) ||
                                      (*(double *)(pTVar30 + 0x58) != 12.0)))))))))) ||
                                 (((NAN(*(double *)(pTVar30 + 0x58)) ||
                                   (*(double *)(pTVar30 + 0x60) != 13.0)) ||
                                  ((NAN(*(double *)(pTVar30 + 0x60)) ||
                                   (((*(double *)(pTVar30 + 0x68) != 14.0 ||
                                     (NAN(*(double *)(pTVar30 + 0x68)))) ||
                                    ((*(double *)(pTVar30 + 0x70) != 15.0 ||
                                     ((((NAN(*(double *)(pTVar30 + 0x70)) ||
                                        (*(double *)(pTVar30 + 0x78) != 16.0)) ||
                                       (NAN(*(double *)(pTVar30 + 0x78)))) ||
                                      ((*(double *)(pTVar30 + 0x80) != 17.0 ||
                                       (NAN(*(double *)(pTVar30 + 0x80)))))))))))))))) {
                                __assert_fail("hdr.typedAttribute<M44dAttribute> (\"a17\").value () == a17"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x11f,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar31 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<double>>>
                                                  (pHVar13,"a18");
                              if (((*(double *)(pTVar31 + 8) != 27.51) ||
                                  (NAN(*(double *)(pTVar31 + 8)))) ||
                                 ((*(double *)(pTVar31 + 0x10) != 28.51 ||
                                  (NAN(*(double *)(pTVar31 + 0x10)))))) {
                                __assert_fail("hdr.typedAttribute<V2dAttribute> (\"a18\").value () == a18"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x120,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar32 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<double>>>
                                                  (pHVar13,"a19");
                              if ((((*(double *)(pTVar32 + 8) != 37.51) ||
                                   (NAN(*(double *)(pTVar32 + 8)))) ||
                                  (*(double *)(pTVar32 + 0x10) != 38.51)) ||
                                 (((NAN(*(double *)(pTVar32 + 0x10)) ||
                                   (*(double *)(pTVar32 + 0x18) != 39.51)) ||
                                  (NAN(*(double *)(pTVar32 + 0x18)))))) {
                                __assert_fail("hdr.typedAttribute<V3dAttribute> (\"a19\").value () == a19"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x121,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar28 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                                  (pHVar13,"a20");
                              if (((long)*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           **)(pTVar28 + 0x10) -
                                   (long)*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           **)(pTVar28 + 8) !=
                                   (long)a20.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)a20.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) ||
                                 (bVar10 = std::__equal<false>::
                                           equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                                     (*(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  **)(pTVar28 + 8),
                                                  *(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  **)(pTVar28 + 0x10),
                                                  a20.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                                 !bVar10)) {
                                __assert_fail("hdr.typedAttribute<StringVectorAttribute> (\"a20\").value () == a20"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x124,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar33 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::DeepImageState>>
                                                  (pHVar13,"a21");
                              if (*(int *)(pTVar33 + 8) != 3) {
                                __assert_fail("hdr.typedAttribute<DeepImageStateAttribute> (\"a21\").value () == a21"
                                              ,
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                              ,0x128,
                                              "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                             );
                              }
                              pTVar34 = Imf_3_4::Header::
                                        typedAttribute<Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>>
                                                  (pHVar13,"a22");
                              pfVar42 = *(float **)(pTVar34 + 8);
                              pfVar44 = (float *)0x0;
                              if (*(float **)(pTVar34 + 0x10) == pfVar42) {
                                while( true ) {
                                  if (pfVar42 == *(float **)(pTVar34 + 0x10)) {
                                    pTVar34 = Imf_3_4::Header::
                                              typedAttribute<Imf_3_4::TypedAttribute<std::vector<float,std::allocator<float>>>>
                                                        (pHVar13,"a23");
                                    pfVar42 = *(float **)(pTVar34 + 8);
                                    pfVar45 = a23.super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start;
                                    if ((long)*(float **)(pTVar34 + 0x10) - (long)pfVar42 ==
                                        (long)a23.super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)a23.super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start) {
                                      while( true ) {
                                        if (pfVar42 == *(float **)(pTVar34 + 0x10)) {
                                          plVar35 = (long *)Imf_3_4::Header::operator[]
                                                                      ((char *)pHVar13);
                                          pOVar36 = (OpaqueAttribute *)
                                                    __dynamic_cast(plVar35,&Imf_3_4::Attribute::
                                                                            typeinfo,
                                                                   &Imf_3_4::OpaqueAttribute::
                                                                    typeinfo,0);
                                          if (pOVar36 == (OpaqueAttribute *)0x0) {
                                            __assert_fail("oa",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x136,
                                                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                                  );
                                          }
                                          pcVar11 = (char *)(**(code **)(*plVar35 + 0x10))(plVar35);
                                          iVar41 = strcmp(pcVar11,"testOpaque");
                                          if (iVar41 != 0) {
                                            __assert_fail("!strcmp (a.typeName (), \"testOpaque\")",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x137,
                                                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                                  );
                                          }
                                          Imf_3_4::OpaqueAttribute::OpaqueAttribute
                                                    ((OpaqueAttribute *)&out,pOVar36);
                                          pcVar11 = (char *)Imf_3_4::OpaqueAttribute::typeName();
                                          __s2 = (char *)(**(code **)(*plVar35 + 0x10))(plVar35);
                                          iVar41 = strcmp(pcVar11,__s2);
                                          if (iVar41 != 0) {
                                            __assert_fail("!strcmp (b.typeName (), a.typeName ())",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x13b,
                                                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                                  );
                                          }
                                          if (local_400 != *(uint *)(pOVar36 + 0x28)) {
                                            __assert_fail("b.dataSize () == oa->dataSize ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x13c,
                                                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                                  );
                                          }
                                          if (0 < (int)local_400) {
                                            uVar47 = 0;
                                            do {
                                              if (*(char *)(local_3f0 + uVar47) !=
                                                  *(char *)(*(long *)(pOVar36 + 0x38) + uVar47)) {
                                                __assert_fail("b.data ()[i] == oa->data ()[i]",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x13e,
                                                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                                  );
                                              }
                                              uVar47 = uVar47 + 1;
                                            } while ((local_400 & 0x7fffffff) != uVar47);
                                          }
                                          Imf_3_4::OpaqueAttribute::~OpaqueAttribute
                                                    ((OpaqueAttribute *)&out);
                                          if (local_308 !=
                                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                            _M_release(local_308);
                                          }
                                          if (local_318 !=
                                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                            _M_release(local_318);
                                          }
                                          remove(_Var8._M_p);
                                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) +
                                                          -0x60);
                                          std::ostream::put(-0x60);
                                          std::ostream::flush();
                                          if (a23.super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start !=
                                              (pointer)0x0) {
                                            operator_delete(a23.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start,
                                                  (long)a23.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)a23.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                                          }
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::~vector(&a20);
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::~vector(&a15);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)a7._M_dataplus._M_p != &a7.field_2) {
                                            operator_delete(a7._M_dataplus._M_p,
                                                            a7.field_2._M_allocated_capacity + 1);
                                          }
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"channel list",0xc);
                                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) +
                                                          -0x60);
                                          std::ostream::put(-0x60);
                                          std::ostream::flush();
                                          p_Var1 = &channels._map._M_t._M_impl.super__Rb_tree_header
                                          ;
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._0_8_ = channels._map._M_t._M_impl.super__Rb_tree_header.
                                                   _M_header._0_8_ & 0xffffffff00000000;
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._M_parent = (_Base_ptr)0x0;
                                          channels._map._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count = 0;
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._M_left = &p_Var1->_M_header;
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._M_right = &p_Var1->_M_header;
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)"b0");
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)"b1");
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)"b2");
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)"d3");
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)"e4");
                                          first._i._M_node = (iterator)(_Base_ptr)0x0;
                                          last._i._M_node = (iterator)(_Base_ptr)0x0;
                                          Imf_3_4::ChannelList::channelsWithPrefix
                                                    ((char *)&channels,(Iterator *)0x1c8a60,&first);
                                          IVar4 = first;
                                          iVar37._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
                                          if (IVar4._i._M_node == (iterator)iVar37._M_node) {
                                            __assert_fail("first != channels.end ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x159,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (first._i._M_node != last._i._M_node) {
                                            __assert_fail("first == last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x15a,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          Imf_3_4::ChannelList::channelsWithPrefix
                                                    ((char *)&channels,(Iterator *)0x1be2b4,&first);
                                          IVar4 = first;
                                          iVar37._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
                                          IVar7 = last;
                                          IVar5 = first;
                                          if (IVar4._i._M_node == (iterator)iVar37._M_node) {
                                            __assert_fail("first != channels.end ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x15d,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (first._i._M_node == last._i._M_node) {
                                            __assert_fail("first != last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x15e,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          iVar37._M_node =
                                               (_Base_ptr)std::_Rb_tree_increment(first._i._M_node);
                                          first._i._M_node = (iterator)(iterator)iVar37._M_node;
                                          strncpy((char *)&out,"b0",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)((long)IVar5._i._M_node + 0x20),
                                                          (char *)&out);
                                          if (iVar41 != 0) {
                                            __assert_fail("first++.name () == Name (\"b0\")",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x15f,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          iVar38._M_node =
                                               (_Base_ptr)std::_Rb_tree_increment(iVar37._M_node);
                                          first._i._M_node = (iterator)(iterator)iVar38._M_node;
                                          strncpy((char *)&out,"b1",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)(iVar37._M_node + 1),(char *)&out)
                                          ;
                                          if (iVar41 != 0) {
                                            __assert_fail("first++.name () == Name (\"b1\")",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x160,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          iVar37._M_node =
                                               (_Base_ptr)std::_Rb_tree_increment(iVar38._M_node);
                                          first._i._M_node = (iterator)(iterator)iVar37._M_node;
                                          strncpy((char *)&out,"b2",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)(iVar38._M_node + 1),(char *)&out)
                                          ;
                                          if (iVar41 != 0) {
                                            __assert_fail("first++.name () == Name (\"b2\")",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x161,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if ((iterator)iVar37._M_node != IVar7._i._M_node) {
                                            __assert_fail("first == last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x162,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          Imf_3_4::ChannelList::channelsWithPrefix
                                                    ((char *)&channels,(Iterator *)"b1",&first);
                                          IVar4 = first;
                                          iVar37._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
                                          IVar7 = last;
                                          IVar5 = first;
                                          if (IVar4._i._M_node == (iterator)iVar37._M_node) {
                                            __assert_fail("first != channels.end ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x165,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (first._i._M_node == last._i._M_node) {
                                            __assert_fail("first != last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x166,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          iVar37._M_node =
                                               (_Base_ptr)std::_Rb_tree_increment(first._i._M_node);
                                          first._i._M_node = (iterator)(iterator)iVar37._M_node;
                                          strncpy((char *)&out,"b1",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)((long)IVar5._i._M_node + 0x20),
                                                          (char *)&out);
                                          if (iVar41 != 0) {
                                            __assert_fail("first++.name () == Name (\"b1\")",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x167,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if ((iterator)iVar37._M_node != IVar7._i._M_node) {
                                            __assert_fail("first == last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x168,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          Imf_3_4::ChannelList::channelsWithPrefix
                                                    ((char *)&channels,(Iterator *)"b11",&first);
                                          IVar4 = first;
                                          iVar37._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
                                          if (IVar4._i._M_node == (iterator)iVar37._M_node) {
                                            __assert_fail("first != channels.end ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x16b,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (first._i._M_node != last._i._M_node) {
                                            __assert_fail("first == last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x16c,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          Imf_3_4::ChannelList::channelsWithPrefix
                                                    ((char *)&channels,(Iterator *)0x1ba269,&first);
                                          IVar4 = first;
                                          iVar37._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
                                          if (IVar4._i._M_node == (iterator)iVar37._M_node) {
                                            __assert_fail("first != channels.end ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x16f,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (first._i._M_node != last._i._M_node) {
                                            __assert_fail("first == last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x170,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          Imf_3_4::ChannelList::channelsWithPrefix
                                                    ((char *)&channels,(Iterator *)0x1b7749,&first);
                                          IVar4 = first;
                                          iVar37._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
                                          IVar7 = last;
                                          IVar5 = first;
                                          if (IVar4._i._M_node == (iterator)iVar37._M_node) {
                                            __assert_fail("first != channels.end ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x173,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (first._i._M_node == last._i._M_node) {
                                            __assert_fail("first != last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x174,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          iVar37._M_node =
                                               (_Base_ptr)std::_Rb_tree_increment(first._i._M_node);
                                          first._i._M_node = (iterator)(iterator)iVar37._M_node;
                                          strncpy((char *)&out,"d3",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)((long)IVar5._i._M_node + 0x20),
                                                          (char *)&out);
                                          if (iVar41 != 0) {
                                            __assert_fail("first++.name () == Name (\"d3\")",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x175,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if ((iterator)iVar37._M_node != IVar7._i._M_node) {
                                            __assert_fail("first == last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x176,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          Imf_3_4::ChannelList::channelsWithPrefix
                                                    ((char *)&channels,(Iterator *)0x1c1733,&first);
                                          IVar4 = first;
                                          iVar37._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
                                          IVar7 = last;
                                          IVar5 = first;
                                          if (IVar4._i._M_node == (iterator)iVar37._M_node) {
                                            __assert_fail("first != channels.end ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x179,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (first._i._M_node == last._i._M_node) {
                                            __assert_fail("first != last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x17a,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          iVar37._M_node =
                                               (_Base_ptr)std::_Rb_tree_increment(first._i._M_node);
                                          first._i._M_node = (iterator)(iterator)iVar37._M_node;
                                          strncpy((char *)&out,"e4",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)((long)IVar5._i._M_node + 0x20),
                                                          (char *)&out);
                                          if (iVar41 != 0) {
                                            __assert_fail("first++.name () == Name (\"e4\")",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x17b,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if ((iterator)iVar37._M_node != IVar7._i._M_node) {
                                            __assert_fail("first == last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x17c,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          Imf_3_4::ChannelList::channelsWithPrefix
                                                    ((char *)&channels,(Iterator *)0x1bfb4c,&first);
                                          IVar4 = first;
                                          iVar37._M_node = (_Base_ptr)Imf_3_4::ChannelList::end();
                                          if (IVar4._i._M_node != (iterator)iVar37._M_node) {
                                            __assert_fail("first == channels.end ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x17f,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (first._i._M_node != last._i._M_node) {
                                            __assert_fail("first == last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x180,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          std::
                                          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
                                          ::~_Rb_tree((
                                                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
                                                  *)&channels);
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._0_8_ = channels._map._M_t._M_impl.super__Rb_tree_header.
                                                   _M_header._0_8_ & 0xffffffff00000000;
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._M_parent = (_Base_ptr)0x0;
                                          channels._map._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count = 0;
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._M_left = &p_Var1->_M_header;
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._M_right = &p_Var1->_M_header;
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)0x1c8a60);
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)0x1c8a5f);
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)"a.");
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)0x1b8824);
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)0x1b8837);
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)0x1b884a);
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,
                                                     (Channel *)"layer1.sublayer1.AA");
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,
                                                     (Channel *)"layer1.sublayer1.R");
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,
                                                     (Channel *)"layer1.sublayer1.G");
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,
                                                     (Channel *)"layer1.sublayer1.B");
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,
                                                     (Channel *)"layer1.sublayer2.R");
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)0x1b885d);
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)"layer2.G");
                                          Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    ((char *)&channels,(Channel *)"layer2.B");
                                          dStack_470 = (double)((ulong)dStack_470 &
                                                               0xffffffff00000000);
                                          local_468 = (_Base_ptr)0x0;
                                          dStack_450 = 0.0;
                                          p_Stack_460 = (_Rb_tree_node_base *)&dStack_470;
                                          local_458 = (_Rb_tree_node_base *)&dStack_470;
                                          Imf_3_4::ChannelList::layers((set *)&channels);
                                          p_Var6 = p_Stack_460;
                                          p_Var39 = (_Rb_tree_node_base *)
                                                    std::_Rb_tree_increment(p_Stack_460);
                                          iVar41 = std::__cxx11::string::compare
                                                             ((char *)(p_Var6 + 1));
                                          if (iVar41 != 0) {
                                            __assert_fail("*i++ == \"layer1\"",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x19f,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          p_Var40 = (_Rb_tree_node_base *)
                                                    std::_Rb_tree_increment(p_Var39);
                                          iVar41 = std::__cxx11::string::compare
                                                             ((char *)(p_Var39 + 1));
                                          if (iVar41 != 0) {
                                            __assert_fail("*i++ == \"layer1.sublayer1\"",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1a0,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          p_Var39 = (_Rb_tree_node_base *)
                                                    std::_Rb_tree_increment(p_Var40);
                                          iVar41 = std::__cxx11::string::compare
                                                             ((char *)(p_Var40 + 1));
                                          if (iVar41 != 0) {
                                            __assert_fail("*i++ == \"layer1.sublayer2\"",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1a1,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          p_Var40 = (_Rb_tree_node_base *)
                                                    std::_Rb_tree_increment(p_Var39);
                                          iVar41 = std::__cxx11::string::compare
                                                             ((char *)(p_Var39 + 1));
                                          if (iVar41 != 0) {
                                            __assert_fail("*i++ == \"layer2\"",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1a2,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (p_Var40 != (_Rb_tree_node_base *)&dStack_470) {
                                            __assert_fail("i == layerNames.end ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1a3,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          _hdr = (_Rb_tree_node_base *)0x0;
                                          fb._map._M_t._M_impl._0_8_ = 0;
                                          last._i._M_node = (iterator)(_Base_ptr)0x10;
                                          _out = (undefined **)&local_418;
                                          _out = (undefined **)
                                                 std::__cxx11::string::_M_create
                                                           ((ulong *)&out,(ulong)&last);
                                          local_418._M_allocated_capacity =
                                               (size_type)last._i._M_node;
                                          *_out = (undefined *)0x732e31726579616c;
                                          *(char *)((long)_out + 8) = 'u';
                                          *(char *)((long)_out + 9) = 'b';
                                          *(char *)((long)_out + 10) = 'l';
                                          *(char *)((long)_out + 0xb) = 'a';
                                          *(char *)((long)_out + 0xc) = 'y';
                                          *(char *)((long)_out + 0xd) = 'e';
                                          *(char *)((long)_out + 0xe) = 'r';
                                          *(char *)((long)_out + 0xf) = '1';
                                          *(char *)((long)_out + (long)last._i._M_node) = '\0';
                                          Imf_3_4::ChannelList::channelsInLayer
                                                    ((string *)&channels,(ConstIterator *)&out,
                                                     (ConstIterator *)&hdr);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)_out != &local_418) {
                                            operator_delete(_out,(ulong)(local_418.
                                                                         _M_allocated_capacity + 1))
                                            ;
                                          }
                                          p_Var40 = (_Rb_tree_node_base *)
                                                    Imf_3_4::ChannelList::end();
                                          uVar9 = fb._map._M_t._M_impl._0_8_;
                                          p_Var39 = _hdr;
                                          if (_hdr == p_Var40) {
                                            __assert_fail("first != channels.end ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1a8,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (_hdr == (_Rb_tree_node_base *)
                                                      fb._map._M_t._M_impl._0_8_) {
                                            __assert_fail("first != last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1a9,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          p_Var40 = (_Rb_tree_node_base *)
                                                    std::_Rb_tree_increment(_hdr);
                                          _hdr = p_Var40;
                                          strncpy((char *)&out,"layer1.sublayer1.AA",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)(p_Var39 + 1),(char *)&out);
                                          if (iVar41 != 0) {
                                            __assert_fail(
                                                  "first++.name () == Name (\"layer1.sublayer1.AA\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1aa,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          p_Var39 = (_Rb_tree_node_base *)
                                                    std::_Rb_tree_increment(p_Var40);
                                          _hdr = p_Var39;
                                          strncpy((char *)&out,"layer1.sublayer1.B",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)(p_Var40 + 1),(char *)&out);
                                          if (iVar41 != 0) {
                                            __assert_fail(
                                                  "first++.name () == Name (\"layer1.sublayer1.B\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1ab,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          p_Var40 = (_Rb_tree_node_base *)
                                                    std::_Rb_tree_increment(p_Var39);
                                          _hdr = p_Var40;
                                          strncpy((char *)&out,"layer1.sublayer1.G",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)(p_Var39 + 1),(char *)&out);
                                          if (iVar41 != 0) {
                                            __assert_fail(
                                                  "first++.name () == Name (\"layer1.sublayer1.G\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1ac,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          p_Var39 = (_Rb_tree_node_base *)
                                                    std::_Rb_tree_increment(p_Var40);
                                          _hdr = p_Var39;
                                          strncpy((char *)&out,"layer1.sublayer1.R",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)(p_Var40 + 1),(char *)&out);
                                          if (iVar41 != 0) {
                                            __assert_fail(
                                                  "first++.name () == Name (\"layer1.sublayer1.R\")"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1ad,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (p_Var39 != (_Rb_tree_node_base *)uVar9) {
                                            __assert_fail("first == last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1ae,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          local_418._M_allocated_capacity._0_7_ = 0x32726579616c;
                                          _out = (undefined **)&local_418;
                                          Imf_3_4::ChannelList::channelsInLayer
                                                    ((string *)&channels,(ConstIterator *)&out,
                                                     (ConstIterator *)&hdr);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)_out != &local_418) {
                                            operator_delete(_out,local_418._M_allocated_capacity + 1
                                                           );
                                          }
                                          p_Var40 = (_Rb_tree_node_base *)
                                                    Imf_3_4::ChannelList::end();
                                          uVar9 = fb._map._M_t._M_impl._0_8_;
                                          p_Var39 = _hdr;
                                          if (_hdr == p_Var40) {
                                            __assert_fail("first != channels.end ()",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1b1,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (_hdr == (_Rb_tree_node_base *)
                                                      fb._map._M_t._M_impl._0_8_) {
                                            __assert_fail("first != last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1b2,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          p_Var40 = (_Rb_tree_node_base *)
                                                    std::_Rb_tree_increment(_hdr);
                                          _hdr = p_Var40;
                                          strncpy((char *)&out,"layer2.B",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)(p_Var39 + 1),(char *)&out);
                                          if (iVar41 != 0) {
                                            __assert_fail("first++.name () == Name (\"layer2.B\")",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1b3,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          p_Var39 = (_Rb_tree_node_base *)
                                                    std::_Rb_tree_increment(p_Var40);
                                          _hdr = p_Var39;
                                          strncpy((char *)&out,"layer2.G",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)(p_Var40 + 1),(char *)&out);
                                          if (iVar41 != 0) {
                                            __assert_fail("first++.name () == Name (\"layer2.G\")",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1b4,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          lVar46 = std::_Rb_tree_increment(p_Var39);
                                          _hdr = (_Rb_tree_node_base *)lVar46;
                                          strncpy((char *)&out,"layer2.R",0xff);
                                          local_329 = 0;
                                          iVar41 = strcmp((char *)(p_Var39 + 1),(char *)&out);
                                          if (iVar41 != 0) {
                                            __assert_fail("first++.name () == Name (\"layer2.R\")",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1b5,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          if (lVar46 != uVar9) {
                                            __assert_fail("first == last",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1b6,"void (anonymous namespace)::channelList()"
                                                  );
                                          }
                                          std::
                                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::~_Rb_tree((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&first);
                                          std::
                                          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
                                          ::~_Rb_tree((
                                                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
                                                  *)&channels);
                                          _Var8 = filename._M_dataplus;
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._0_8_ = channels._map._M_t._M_impl.super__Rb_tree_header.
                                                   _M_header._0_8_ & 0xffffffff00000000;
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._M_parent = (_Base_ptr)0x0;
                                          channels._map._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count = 0;
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._M_left = &p_Var1->_M_header;
                                          channels._map._M_t._M_impl.super__Rb_tree_header._M_header
                                          ._M_right = &p_Var1->_M_header;
                                          Imf_3_4::Slice::Slice
                                                    ((Slice *)&out,FLOAT,local_270,4,0x364,1,1,0.0,
                                                     false,false);
                                          Imf_3_4::FrameBuffer::insert
                                                    ((char *)&channels,(Slice *)0x1c52a2);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"only short names",0x10);
                                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) +
                                                          -0x60);
                                          std::ostream::put(-0x60);
                                          std::ostream::flush();
                                          first._i._M_node = (iterator)(_Base_ptr)0x0;
                                          Imf_3_4::Header::Header
                                                    ((Header *)&out,0xd9,0xc5,1.0,(Vec2 *)&first,1.0
                                                     ,INCREASING_Y,ZIP_COMPRESSION);
                                          pcVar11 = (char *)Imf_3_4::Header::channels();
                                          Imf_3_4::Channel::Channel
                                                    ((Channel *)&first,FLOAT,1,1,false);
                                          Imf_3_4::ChannelList::insert(pcVar11,(Channel *)0x1c52a2);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"writing",7);
                                          std::ostream::flush();
                                          remove(_Var8._M_p);
                                          iVar41 = Imf_3_4::globalThreadCount();
                                          Imf_3_4::OutputFile::OutputFile
                                                    ((OutputFile *)&first,_Var8._M_p,(Header *)&out,
                                                     iVar41);
                                          Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&first)
                                          ;
                                          iVar43 = (int)&first;
                                          Imf_3_4::OutputFile::writePixels(iVar43);
                                          Imf_3_4::OutputFile::~OutputFile((OutputFile *)&first);
                                          Imf_3_4::Header::~Header((Header *)&out);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout," reading",8);
                                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) +
                                                          -0x60);
                                          std::ostream::put(-0x60);
                                          std::ostream::flush();
                                          iVar41 = Imf_3_4::globalThreadCount();
                                          Imf_3_4::InputFile::InputFile
                                                    ((InputFile *)&out,_Var8._M_p,iVar41);
                                          uVar50 = Imf_3_4::InputFile::version();
                                          if ((uVar50 >> 10 & 1) != 0) {
                                            __assert_fail("!(in.version () & LONG_NAMES_FLAG)",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x1e9,
                                                  "void (anonymous namespace)::longNames(const Array2D<float> &, const char *, int, int)"
                                                  );
                                          }
                                          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   CONCAT44(local_418._12_4_,
                                                            CONCAT13(local_418._M_local_buf[0xb],
                                                                     CONCAT12(local_418._M_local_buf
                                                                              [10],local_418._8_2_))
                                                           );
                                          if (p_Var3 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                             ) {
                                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                            _M_release(p_Var3);
                                          }
                                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                          _M_release((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *
                                                     )0x6);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"long attribute name",
                                                     0x13);
                                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) +
                                                          -0x60);
                                          std::ostream::put(-0x60);
                                          std::ostream::flush();
                                          first._i._M_node = (iterator)(_Base_ptr)0x0;
                                          Imf_3_4::Header::Header
                                                    ((Header *)&out,0xd9,0xc5,1.0,(Vec2 *)&first,1.0
                                                     ,INCREASING_Y,ZIP_COMPRESSION);
                                          local_2a8 = CONCAT62(local_2a8._2_6_,0x79);
                                          last._i._M_node = (iterator)(iterator)&local_2a8;
                                          Imf_3_4::TypedAttribute<std::__cxx11::string>::
                                          TypedAttribute((string *)&first);
                                          Imf_3_4::Header::insert
                                                    ((char *)&out,
                                                     (Attribute *)"x2345678901234567890123456789012"
                                                    );
                                          Imf_3_4::TypedAttribute<std::__cxx11::string>::
                                          ~TypedAttribute((TypedAttribute<std::__cxx11::string> *)
                                                          &first);
                                          if (last._i._M_node != (_Base_ptr)&local_2a8) {
                                            operator_delete((void *)last._i._M_node,local_2a8 + 1);
                                          }
                                          pcVar11 = (char *)Imf_3_4::Header::channels();
                                          Imf_3_4::Channel::Channel
                                                    ((Channel *)&first,FLOAT,1,1,false);
                                          Imf_3_4::ChannelList::insert(pcVar11,(Channel *)0x1c52a2);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"writing",7);
                                          std::ostream::flush();
                                          remove(_Var8._M_p);
                                          iVar41 = Imf_3_4::globalThreadCount();
                                          Imf_3_4::OutputFile::OutputFile
                                                    ((OutputFile *)&first,_Var8._M_p,(Header *)&out,
                                                     iVar41);
                                          Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&first)
                                          ;
                                          Imf_3_4::OutputFile::writePixels(iVar43);
                                          Imf_3_4::OutputFile::~OutputFile((OutputFile *)&first);
                                          Imf_3_4::Header::~Header((Header *)&out);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout," reading",8);
                                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) +
                                                          -0x60);
                                          std::ostream::put(-0x60);
                                          std::ostream::flush();
                                          iVar41 = Imf_3_4::globalThreadCount();
                                          Imf_3_4::InputFile::InputFile
                                                    ((InputFile *)&out,_Var8._M_p,iVar41);
                                          uVar50 = Imf_3_4::InputFile::version();
                                          if ((uVar50 >> 10 & 1) == 0) {
                                            __assert_fail("in.version () & LONG_NAMES_FLAG",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x208,
                                                  "void (anonymous namespace)::longNames(const Array2D<float> &, const char *, int, int)"
                                                  );
                                          }
                                          pHVar13 = (Header *)Imf_3_4::InputFile::header();
                                          pTVar20 = Imf_3_4::Header::
                                                                                                        
                                                  typedAttribute<Imf_3_4::TypedAttribute<std::__cxx11::string>>
                                                            (pHVar13,
                                                  "x2345678901234567890123456789012");
                                          iVar41 = std::__cxx11::string::compare
                                                             ((char *)(pTVar20 + 8));
                                          if (iVar41 != 0) {
                                            __assert_fail(
                                                  "hdr.typedAttribute<StringAttribute> (longName).value () == \"y\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x20b,
                                                  "void (anonymous namespace)::longNames(const Array2D<float> &, const char *, int, int)"
                                                  );
                                          }
                                          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   CONCAT44(local_418._12_4_,
                                                            CONCAT13(local_418._M_local_buf[0xb],
                                                                     CONCAT12(local_418._M_local_buf
                                                                              [10],local_418._8_2_))
                                                           );
                                          if (p_Var3 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                             ) {
                                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                            _M_release(p_Var3);
                                          }
                                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                          _M_release((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *
                                                     )0x6);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"long channel name",0x11)
                                          ;
                                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) +
                                                          -0x60);
                                          std::ostream::put(-0x60);
                                          std::ostream::flush();
                                          first._i._M_node = (iterator)(_Base_ptr)0x0;
                                          Imf_3_4::Header::Header
                                                    ((Header *)&out,0xd9,0xc5,1.0,(Vec2 *)&first,1.0
                                                     ,INCREASING_Y,ZIP_COMPRESSION);
                                          pcVar11 = (char *)Imf_3_4::Header::channels();
                                          Imf_3_4::Channel::Channel
                                                    ((Channel *)&first,FLOAT,1,1,false);
                                          Imf_3_4::ChannelList::insert
                                                    (pcVar11,(Channel *)
                                                             "x2345678901234567890123456789012");
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"writing",7);
                                          std::ostream::flush();
                                          remove(_Var8._M_p);
                                          iVar41 = Imf_3_4::globalThreadCount();
                                          Imf_3_4::OutputFile::OutputFile
                                                    ((OutputFile *)&first,_Var8._M_p,(Header *)&out,
                                                     iVar41);
                                          Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&first)
                                          ;
                                          Imf_3_4::OutputFile::writePixels(iVar43);
                                          Imf_3_4::OutputFile::~OutputFile((OutputFile *)&first);
                                          Imf_3_4::Header::~Header((Header *)&out);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout," reading",8);
                                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) +
                                                          -0x60);
                                          std::ostream::put(-0x60);
                                          std::ostream::flush();
                                          iVar41 = Imf_3_4::globalThreadCount();
                                          Imf_3_4::InputFile::InputFile
                                                    ((InputFile *)&out,_Var8._M_p,iVar41);
                                          uVar50 = Imf_3_4::InputFile::version();
                                          if ((uVar50 >> 10 & 1) == 0) {
                                            __assert_fail("in.version () & LONG_NAMES_FLAG",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x227,
                                                  "void (anonymous namespace)::longNames(const Array2D<float> &, const char *, int, int)"
                                                  );
                                          }
                                          Imf_3_4::InputFile::header();
                                          pcVar11 = (char *)Imf_3_4::Header::channels();
                                          lVar46 = Imf_3_4::ChannelList::findChannel(pcVar11);
                                          if (lVar46 == 0) {
                                            __assert_fail("hdr.channels ().findChannel (longName)",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x22a,
                                                  "void (anonymous namespace)::longNames(const Array2D<float> &, const char *, int, int)"
                                                  );
                                          }
                                          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   CONCAT44(local_418._12_4_,
                                                            CONCAT13(local_418._M_local_buf[0xb],
                                                                     CONCAT12(local_418._M_local_buf
                                                                              [10],local_418._8_2_))
                                                           );
                                          if (p_Var3 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                             ) {
                                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                            _M_release(p_Var3);
                                          }
                                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                          _M_release((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *
                                                     )0x6);
                                          remove(_Var8._M_p);
                                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) +
                                                          -0x60);
                                          std::ostream::put(-0x60);
                                          std::ostream::flush();
                                          std::
                                          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                                          ::~_Rb_tree((
                                                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                                                  *)&channels);
                                          _out = (undefined **)0x0;
                                          Imf_3_4::Attribute::Attribute((Attribute *)&out);
                                          _out = (undefined **)
                                                 Imf_3_4::TiledRgbaInputFile::numYTiles;
                                          print_type<int>((TypedAttribute<int> *)&out);
                                          Imf_3_4::TypedAttribute<int>::~TypedAttribute
                                                    ((TypedAttribute<int> *)&out);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"ok\n",3);
                                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) +
                                                          -0x60);
                                          std::ostream::put(-0x60);
                                          std::ostream::flush();
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)filename._M_dataplus._M_p != &filename.field_2) {
                                            operator_delete(filename._M_dataplus._M_p,
                                                            filename.field_2._M_allocated_capacity +
                                                            1);
                                          }
                                          operator_delete__(local_270);
                                          return;
                                        }
                                        if ((*pfVar42 != *pfVar45) ||
                                           (NAN(*pfVar42) || NAN(*pfVar45))) break;
                                        pfVar42 = pfVar42 + 1;
                                        pfVar45 = pfVar45 + 1;
                                      }
                                    }
                                    __assert_fail("hdr.typedAttribute<FloatVectorAttribute> (\"a23\").value () == a23"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                                  ,0x12e,
                                                  "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                                 );
                                  }
                                  if ((*pfVar42 != *pfVar44) || (NAN(*pfVar42) || NAN(*pfVar44)))
                                  break;
                                  pfVar42 = pfVar42 + 1;
                                  pfVar44 = pfVar44 + 1;
                                }
                              }
                              __assert_fail("hdr.typedAttribute<FloatVectorAttribute> (\"a22\").value () == a22"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                                            ,299,
                                            "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
                                           );
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("hdr.typedAttribute<M44fAttribute> (\"a6\").value () == a6",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testAttributes.cpp"
                ,0xed,
                "void (anonymous namespace)::writeReadAttr(const Array2D<float> &, const char *, int, int)"
               );
}

Assistant:

void
testAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing built-in attributes" << endl;

        const int W = 217;
        const int H = 197;

        Array2D<float> pf (H, W);
        fillPixels (pf, W, H);

        std::string filename = tempDir + "imf_test_attr.exr";

        writeReadAttr (pf, filename.c_str (), W, H);
        channelList ();
        longNames (pf, filename.c_str (), W, H);

        print_type (OPENEXR_IMF_NAMESPACE::TypedAttribute<int> ());

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}